

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O2

int fprint<unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
              (FILE *out,char *fmt,unsigned_long *args,unsigned_long *args_1,unsigned_long *args_2,
              unsigned_long *args_3,unsigned_long *args_4,unsigned_long *args_5,
              unsigned_long *args_6,uchar *args_7,unsigned_short *args_8,uint *args_9,
              unsigned_long *args_10)

{
  size_t sVar1;
  string str;
  
  stringformat<unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
            (&str,fmt,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10);
  sVar1 = fwrite(str._M_dataplus._M_p,str._M_string_length,1,(FILE *)out);
  std::__cxx11::string::~string((string *)&str);
  return (int)sVar1;
}

Assistant:

int fprint(FILE *out, const char *fmt, ARGS&&...args)
{
    auto str = stringformat(fmt, std::forward<ARGS>(args)...);
    return fwrite(str.c_str(), str.size(), 1, out);
}